

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureAllocator.h
# Opt level: O0

pointer __thiscall
SecureAllocator<unsigned_char>::allocate
          (SecureAllocator<unsigned_char> *this,size_type n,void *param_3)

{
  ulong in_RSI;
  pointer r;
  SecureMemoryRegistry *in_stack_00000020;
  pointer local_8;
  
  local_8 = (pointer)operator_new(in_RSI);
  if (local_8 == (pointer)0x0) {
    softHSMLog(3,"allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureAllocator.h"
               ,0x8c,"Out of memory");
    local_8 = (pointer)0x0;
  }
  else {
    SecureMemoryRegistry::i();
    SecureMemoryRegistry::add(in_stack_00000020,this,n);
  }
  return local_8;
}

Assistant:

inline pointer allocate(size_type n, const void* = NULL)
	{
#ifdef SENSITIVE_NON_PAGED
		// Allocate memory on a page boundary
#ifndef _WIN32
		pointer r = (pointer) valloc(n * sizeof(T));
#else
		pointer r = (pointer) VirtualAlloc(NULL, n * sizeof(T), MEM_COMMIT | MEM_RESERVE, PAGE_READWRITE);
#endif

		if (r == NULL)
		{
			ERROR_MSG("Out of memory");

			return NULL;
		}

		// Lock the memory so it doesn't get swapped out
#ifndef _WIN32
		if (mlock((const void*) r, n * sizeof(T)) != 0)
#else
		if (VirtualLock((const void*) r, n * sizeof(T)) == 0)
#endif
		{
			ERROR_MSG("Could not allocate non-paged memory for secure storage");

			// Hmmm... best to not return any allocated space in this case
#ifndef _WIN32
			free(r);
#else
			VirtualFree((const void*) r, MEM_RELEASE);
#endif

			return NULL;
		}

		// Register the memory in the secure memory registry
		SecureMemoryRegistry::i()->add(r, n * sizeof(T));

		return r;
#else
		pointer r = (pointer)(::operator new(n * sizeof(T)));

		if (r == NULL)
		{
			ERROR_MSG("Out of memory");

			return NULL;
		}

		// Register the memory in the secure memory registry
		SecureMemoryRegistry::i()->add(r, n * sizeof(T));

		return r;
#endif // SENSITIVE_NON_PAGED
	}